

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O0

bool __thiscall
ON_SubDMeshFragment::Internal_GetFrameHelper
          (ON_SubDMeshFragment *this,uint P_dex,uint Q_dex,ON_Plane *frame)

{
  double dVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  ON_Plane local_1a0;
  ON_3dVector local_120;
  undefined1 local_108 [8];
  ON_3dVector Y;
  ON_3dVector local_d8;
  undefined1 local_c0 [8];
  ON_3dVector X;
  undefined1 local_90 [8];
  ON_3dVector V;
  ON_3dPoint Q;
  ON_3dVector Z;
  ON_3dPoint P;
  uint P_count;
  ON_Plane *frame_local;
  uint Q_dex_local;
  uint P_dex_local;
  ON_SubDMeshFragment *this_local;
  
  uVar3 = PointCount(this);
  if ((P_dex < uVar3) && (Q_dex < uVar3)) {
    uVar3 = NormalCount(this);
    uVar4 = PointCount(this);
    if (uVar3 == uVar4) {
      VertexPoint((ON_3dPoint *)&Z.z,this,P_dex);
      VertexNormal((ON_3dVector *)&Q.z,this,P_dex);
      bVar2 = ON_3dPoint::IsValid((ON_3dPoint *)&Z.z);
      if ((bVar2) && (bVar2 = ON_3dVector::IsNotZero((ON_3dVector *)&Q.z), bVar2)) {
        VertexPoint((ON_3dPoint *)&V.z,this,Q_dex);
        ON_3dPoint::operator-((ON_3dVector *)&X.z,(ON_3dPoint *)&V.z,(ON_3dPoint *)&Z.z);
        ON_3dVector::UnitVector((ON_3dVector *)local_90,(ON_3dVector *)&X.z);
        dVar1 = ON_3dVector::operator*((ON_3dVector *)&Q.z,(ON_3dVector *)local_90);
        ::operator*((ON_3dVector *)&Y.z,dVar1,(ON_3dVector *)&Q.z);
        ON_3dVector::operator-(&local_d8,(ON_3dVector *)local_90,(ON_3dVector *)&Y.z);
        ON_3dVector::UnitVector((ON_3dVector *)local_c0,&local_d8);
        ON_CrossProduct(&local_120,(ON_3dVector *)&Q.z,(ON_3dVector *)local_c0);
        ON_3dVector::UnitVector((ON_3dVector *)local_108,&local_120);
        bVar2 = ON_3dVector::IsUnitVector((ON_3dVector *)local_c0);
        if ((!bVar2) ||
           (((bVar2 = ON_3dVector::IsUnitVector((ON_3dVector *)local_108), !bVar2 ||
             (dVar1 = ON_3dVector::operator*((ON_3dVector *)local_c0,(ON_3dVector *)&Q.z),
             1.490116119385e-08 < ABS(dVar1))) ||
            (dVar1 = ON_3dVector::operator*((ON_3dVector *)local_108,(ON_3dVector *)&Q.z),
            1.490116119385e-08 < ABS(dVar1))))) {
          ON_Plane::ON_Plane(&local_1a0,(ON_3dPoint *)&Z.z,(ON_3dVector *)&Q.z);
          memcpy(frame,&local_1a0,0x80);
          ON_Plane::~ON_Plane(&local_1a0);
        }
        else {
          (frame->origin).x = Z.z;
          (frame->origin).y = P.x;
          (frame->origin).z = P.y;
          (frame->xaxis).x = (double)local_c0;
          (frame->xaxis).y = X.x;
          (frame->xaxis).z = X.y;
          (frame->yaxis).x = (double)local_108;
          (frame->yaxis).y = Y.x;
          (frame->yaxis).z = Y.y;
          (frame->zaxis).x = Q.z;
          (frame->zaxis).y = Z.x;
          (frame->zaxis).z = Z.y;
          ON_Plane::UpdateEquation(frame);
        }
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool ON_SubDMeshFragment::Internal_GetFrameHelper(
  unsigned int P_dex,
  unsigned int Q_dex,
  ON_Plane& frame
) const
{
  const unsigned int P_count = PointCount();
  if ( P_dex < P_count
    && Q_dex < P_count
    && NormalCount() == PointCount()
    )
  {
    const ON_3dPoint P(VertexPoint(P_dex));
    const ON_3dVector Z(VertexNormal(P_dex));
    if (P.IsValid() && Z.IsNotZero())
    {
      const ON_3dPoint Q(VertexPoint(Q_dex));
      const ON_3dVector V = (Q - P).UnitVector();
      const ON_3dVector X = (V - (Z*V)*Z).UnitVector();
      const ON_3dVector Y = ON_CrossProduct(Z, X).UnitVector();
      if ( X.IsUnitVector() && Y.IsUnitVector() 
        && fabs(X*Z) <= ON_SQRT_EPSILON
        && fabs(Y*Z) <= ON_SQRT_EPSILON
        )
      {
        frame.origin = P;
        frame.xaxis = X;
        frame.yaxis = Y;
        frame.zaxis = Z;
        frame.UpdateEquation();
      }
      else
      {
        frame = ON_Plane(P, Z);
      }
      return true;
    }
  }
  return false;
}